

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O1

int ssl_parse_server_hello_done(mbedtls_ssl_context *ssl)

{
  int iVar1;
  
  iVar1 = mbedtls_ssl_read_record(ssl);
  if ((iVar1 == 0) && (iVar1 = -0x7700, ssl->in_msgtype == 0x16)) {
    if ((ssl->in_hslen == (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8 + 4) &&
       (*ssl->in_msg == '\x0e')) {
      ssl->state = ssl->state + 1;
      iVar1 = 0;
      if ((ssl->conf->field_0x174 & 2) != 0) {
        mbedtls_ssl_recv_flight_completed(ssl);
      }
    }
    else {
      mbedtls_ssl_send_alert_message(ssl,'\x02','2');
      iVar1 = -0x7b80;
    }
  }
  return iVar1;
}

Assistant:

static int ssl_parse_server_hello_done( mbedtls_ssl_context *ssl )
{
    int ret;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse server hello done" ) );

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello done message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    if( ssl->in_hslen  != mbedtls_ssl_hs_hdr_len( ssl ) ||
        ssl->in_msg[0] != MBEDTLS_SSL_HS_SERVER_HELLO_DONE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello done message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO_DONE );
    }

    ssl->state++;

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        mbedtls_ssl_recv_flight_completed( ssl );
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse server hello done" ) );

    return( 0 );
}